

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_s_rxr_shi(DisasContext_conflict1 *s,arg_s_rrr_shi *a,VFPGen2OpSPFn_conflict *gen,
                  int logic_cc,StoreRegKind kind)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  TCGv_i32 var;
  
  tcg_ctx = s->uc->tcg_ctx;
  var = load_reg(s,a->rm);
  gen_arm_shift_im(tcg_ctx,var,a->shty,a->shim,logic_cc);
  (*gen)(tcg_ctx,var,var);
  if (logic_cc != 0) {
    gen_logic_CC(tcg_ctx,var);
  }
  _Var1 = store_reg_kind(s,a->rd,var,kind);
  return _Var1;
}

Assistant:

static bool op_s_rxr_shi(DisasContext *s, arg_s_rrr_shi *a,
                         void (*gen)(TCGContext *, TCGv_i32, TCGv_i32),
                         int logic_cc, StoreRegKind kind)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    tmp = load_reg(s, a->rm);
    gen_arm_shift_im(tcg_ctx, tmp, a->shty, a->shim, logic_cc);

    gen(tcg_ctx, tmp, tmp);
    if (logic_cc) {
        gen_logic_CC(tcg_ctx, tmp);
    }
    return store_reg_kind(s, a->rd, tmp, kind);
}